

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int insmod(char *filename,char *options)

{
  void *__ptr;
  char *in_RSI;
  int ret;
  uint size;
  void *module;
  undefined4 local_24;
  uint *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  __ptr = read_file(in_RSI,in_stack_ffffffffffffffe0);
  if (__ptr == (void *)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = init_module(__ptr,local_24,in_RSI);
    free(__ptr);
  }
  return local_4;
}

Assistant:

static int insmod(const char *filename, char *options)
{
    void *module;
    unsigned size;
    int ret;

    module = read_file(filename, &size);
    if (!module)
        return -1;

    ret = init_module(module, size, options);

    free(module);

    return ret;
}